

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::CallIndirect::finalize(CallIndirect *this)

{
  Signature SVar1;
  
  SVar1 = HeapType::getSignature(&this->heapType);
  (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
       SVar1.results.id.id;
  handleUnreachableOperands<wasm::CallIndirect>(this);
  if (this->isReturn == true) {
    (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 1;
  }
  if ((this->target->type).id == 1) {
    (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void CallIndirect::finalize() {
  type = heapType.getSignature().results;
  handleUnreachableOperands(this);
  if (isReturn) {
    type = Type::unreachable;
  }
  if (target->type == Type::unreachable) {
    type = Type::unreachable;
  }
}